

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

void Excel::Parser::handleLabelSST(Record *record,size_t sheetIdx,IStorage *storage)

{
  long *in_RDX;
  undefined8 in_RSI;
  Record *in_RDI;
  int32_t sstIndex;
  int16_t xfIndex;
  int16_t column;
  int16_t row;
  int32_t in_stack_00000034;
  int *in_stack_00000038;
  Stream *in_stack_00000040;
  
  Record::dataStream(in_RDI);
  Stream::read<short>(in_stack_00000040,(short *)in_stack_00000038,in_stack_00000034);
  Record::dataStream(in_RDI);
  Stream::read<short>(in_stack_00000040,(short *)in_stack_00000038,in_stack_00000034);
  Record::dataStream(in_RDI);
  Stream::read<short>(in_stack_00000040,(short *)in_stack_00000038,in_stack_00000034);
  Record::dataStream(in_RDI);
  Stream::read<int>(in_stack_00000040,in_stack_00000038,in_stack_00000034);
  (**(code **)(*in_RDX + 0x28))(in_RDX,in_RSI,0,0,0);
  return;
}

Assistant:

inline void
Parser::handleLabelSST( Record & record, size_t sheetIdx, IStorage & storage )
{
	int16_t row = 0;
	int16_t column = 0;
	int16_t xfIndex = 0;
	int32_t sstIndex = 0;

	record.dataStream().read( row, 2 );
	record.dataStream().read( column, 2 );
	record.dataStream().read( xfIndex, 2 );
	record.dataStream().read( sstIndex, 4 );

	storage.onCellSharedString( sheetIdx, row, column, sstIndex );
}